

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Converter::ConvertToStore
          (Converter *this,char *a_pszString)

{
  ulong a_uOutputDataSize;
  bool bVar1;
  size_t sVar2;
  
  sVar2 = strlen(a_pszString);
  if (sVar2 + 1 != 0xffffffffffffffff) {
    while (a_uOutputDataSize = (this->m_scratch)._M_string_length, a_uOutputDataSize < sVar2 + 1) {
      std::__cxx11::string::resize((ulong)&this->m_scratch);
    }
    bVar1 = SI_ConvertA<char>::ConvertToStore
                      (&this->super_SI_ConvertA<char>,a_pszString,(this->m_scratch)._M_dataplus._M_p
                       ,a_uOutputDataSize);
    return bVar1;
  }
  return false;
}

Assistant:

bool ConvertToStore(const SI_CHAR *a_pszString) {
			size_t uLen = SizeToStore(a_pszString);
			if (uLen == (size_t)(-1)) {
				return false;
			}
			while (uLen > m_scratch.size()) {
				m_scratch.resize(m_scratch.size() * 2);
			}
			return SI_CONVERTER::ConvertToStore(a_pszString, const_cast<char *>(m_scratch.data()), m_scratch.size());
		}